

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O1

SimpleString * __thiscall SimpleString::operator+=(SimpleString *this,char *rhs)

{
  char cVar1;
  char *pcVar2;
  long lVar3;
  size_t n_1;
  long lVar4;
  size_t n;
  size_t sVar5;
  size_t bufferSize;
  bool bVar6;
  
  sVar5 = 0xffffffffffffffff;
  do {
    lVar4 = sVar5 + 1;
    sVar5 = sVar5 + 1;
  } while (this->buffer_[lVar4] != '\0');
  lVar4 = -1;
  bufferSize = sVar5;
  do {
    bufferSize = bufferSize + 1;
    lVar3 = lVar4 + 1;
    lVar4 = lVar4 + 1;
  } while (rhs[lVar3] != '\0');
  pcVar2 = copyToNewBuffer(this->buffer_,bufferSize);
  if ((lVar4 != -1) && (pcVar2 != (char *)0x0)) {
    lVar3 = 0;
    do {
      cVar1 = rhs[lVar3];
      pcVar2[sVar5 + lVar3] = cVar1;
      if (cVar1 == '\0') break;
      bVar6 = lVar4 != lVar3;
      lVar3 = lVar3 + 1;
    } while (bVar6);
  }
  deallocateInternalBuffer(this);
  this->bufferSize_ = bufferSize;
  this->buffer_ = pcVar2;
  return this;
}

Assistant:

SimpleString& SimpleString::operator+=(const char* rhs)
{
    size_t originalSize = this->size();
    size_t additionalStringSize = StrLen(rhs) + 1;
    size_t sizeOfNewString = originalSize + additionalStringSize;
    char* tbuffer = copyToNewBuffer(this->getBuffer(), sizeOfNewString);
    StrNCpy(tbuffer + originalSize, rhs, additionalStringSize);

    setInternalBufferTo(tbuffer, sizeOfNewString);
    return *this;
}